

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::setEigenDecomposition
          (EigenDecompositionSquare<float,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  double *pdVar1;
  uint uVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float *pfVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float *pfVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  
  uVar2 = this->kEigenValuesSize;
  if ((ulong)uVar2 != 0) {
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vpbroadcastq_avx512f();
    uVar17 = 0;
    pfVar12 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex];
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar14 = vpcmpuq_avx512f(auVar22,auVar21,2);
      pdVar1 = inEigenValues + uVar17;
      auVar22._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * (long)pdVar1[1];
      auVar22._0_8_ = (ulong)((byte)uVar14 & 1) * (long)*pdVar1;
      auVar22._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * (long)pdVar1[2];
      auVar22._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * (long)pdVar1[3];
      auVar22._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * (long)pdVar1[4];
      auVar22._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * (long)pdVar1[5];
      auVar22._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * (long)pdVar1[6];
      auVar22._56_8_ = (uVar14 >> 7) * (long)pdVar1[7];
      auVar19 = vcvtpd2ps_avx512f(auVar22);
      pfVar13 = pfVar12 + uVar17;
      bVar4 = (bool)((byte)uVar14 & 1);
      bVar5 = (bool)((byte)(uVar14 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar14 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar14 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar14 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar14 >> 6) & 1);
      bVar11 = SUB81(uVar14 >> 7,0);
      *pfVar13 = (float)((uint)bVar4 * auVar19._0_4_ | (uint)!bVar4 * (int)*pfVar13);
      pfVar13[1] = (float)((uint)bVar5 * auVar19._4_4_ | (uint)!bVar5 * (int)pfVar13[1]);
      pfVar13[2] = (float)((uint)bVar6 * auVar19._8_4_ | (uint)!bVar6 * (int)pfVar13[2]);
      pfVar13[3] = (float)((uint)bVar7 * auVar19._12_4_ | (uint)!bVar7 * (int)pfVar13[3]);
      pfVar13[4] = (float)((uint)bVar8 * auVar19._16_4_ | (uint)!bVar8 * (int)pfVar13[4]);
      pfVar13[5] = (float)((uint)bVar9 * auVar19._20_4_ | (uint)!bVar9 * (int)pfVar13[5]);
      pfVar13[6] = (float)((uint)bVar10 * auVar19._24_4_ | (uint)!bVar10 * (int)pfVar13[6]);
      pfVar13[7] = (float)((uint)bVar11 * auVar19._28_4_ | (uint)!bVar11 * (int)pfVar13[7]);
      uVar17 = uVar17 + 8;
    } while (((ulong)uVar2 + 7 & 0x1fffffff8) != uVar17);
  }
  uVar2 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar17 = (ulong)uVar2;
  if (uVar17 != 0) {
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pfVar12 = this->gEMatrices[eigenIndex];
    uVar14 = (ulong)(uVar2 * uVar2) + 7 & 0x1fffffff8;
    auVar21 = vpbroadcastq_avx512f();
    uVar15 = 0;
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar16 = vpcmpuq_avx512f(auVar22,auVar21,2);
      pdVar1 = inEigenVectors + uVar15;
      auVar23._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * (long)pdVar1[1];
      auVar23._0_8_ = (ulong)((byte)uVar16 & 1) * (long)*pdVar1;
      auVar23._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * (long)pdVar1[2];
      auVar23._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * (long)pdVar1[3];
      auVar23._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * (long)pdVar1[4];
      auVar23._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * (long)pdVar1[5];
      auVar23._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * (long)pdVar1[6];
      auVar23._56_8_ = (uVar16 >> 7) * (long)pdVar1[7];
      auVar19 = vcvtpd2ps_avx512f(auVar23);
      pfVar13 = pfVar12 + uVar15;
      bVar4 = (bool)((byte)uVar16 & 1);
      bVar5 = (bool)((byte)(uVar16 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar16 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar16 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar16 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar16 >> 6) & 1);
      bVar11 = SUB81(uVar16 >> 7,0);
      *pfVar13 = (float)((uint)bVar4 * auVar19._0_4_ | (uint)!bVar4 * (int)*pfVar13);
      pfVar13[1] = (float)((uint)bVar5 * auVar19._4_4_ | (uint)!bVar5 * (int)pfVar13[1]);
      pfVar13[2] = (float)((uint)bVar6 * auVar19._8_4_ | (uint)!bVar6 * (int)pfVar13[2]);
      pfVar13[3] = (float)((uint)bVar7 * auVar19._12_4_ | (uint)!bVar7 * (int)pfVar13[3]);
      pfVar13[4] = (float)((uint)bVar8 * auVar19._16_4_ | (uint)!bVar8 * (int)pfVar13[4]);
      pfVar13[5] = (float)((uint)bVar9 * auVar19._20_4_ | (uint)!bVar9 * (int)pfVar13[5]);
      pfVar13[6] = (float)((uint)bVar10 * auVar19._24_4_ | (uint)!bVar10 * (int)pfVar13[6]);
      pfVar13[7] = (float)((uint)bVar11 * auVar19._28_4_ | (uint)!bVar11 * (int)pfVar13[7]);
      uVar15 = uVar15 + 8;
    } while (uVar14 != uVar15);
    pfVar12 = this->gIMatrices[eigenIndex];
    uVar15 = 0;
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar16 = vpcmpuq_avx512f(auVar22,auVar21,2);
      pdVar1 = inInverseEigenVectors + uVar15;
      auVar24._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * (long)pdVar1[1];
      auVar24._0_8_ = (ulong)((byte)uVar16 & 1) * (long)*pdVar1;
      auVar24._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * (long)pdVar1[2];
      auVar24._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * (long)pdVar1[3];
      auVar24._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * (long)pdVar1[4];
      auVar24._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * (long)pdVar1[5];
      auVar24._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * (long)pdVar1[6];
      auVar24._56_8_ = (uVar16 >> 7) * (long)pdVar1[7];
      auVar19 = vcvtpd2ps_avx512f(auVar24);
      pfVar13 = pfVar12 + uVar15;
      bVar4 = (bool)((byte)uVar16 & 1);
      bVar5 = (bool)((byte)(uVar16 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar16 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar16 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar16 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar16 >> 6) & 1);
      bVar11 = SUB81(uVar16 >> 7,0);
      *pfVar13 = (float)((uint)bVar4 * auVar19._0_4_ | (uint)!bVar4 * (int)*pfVar13);
      pfVar13[1] = (float)((uint)bVar5 * auVar19._4_4_ | (uint)!bVar5 * (int)pfVar13[1]);
      pfVar13[2] = (float)((uint)bVar6 * auVar19._8_4_ | (uint)!bVar6 * (int)pfVar13[2]);
      pfVar13[3] = (float)((uint)bVar7 * auVar19._12_4_ | (uint)!bVar7 * (int)pfVar13[3]);
      pfVar13[4] = (float)((uint)bVar8 * auVar19._16_4_ | (uint)!bVar8 * (int)pfVar13[4]);
      pfVar13[5] = (float)((uint)bVar9 * auVar19._20_4_ | (uint)!bVar9 * (int)pfVar13[5]);
      pfVar13[6] = (float)((uint)bVar10 * auVar19._24_4_ | (uint)!bVar10 * (int)pfVar13[6]);
      pfVar13[7] = (float)((uint)bVar11 * auVar19._28_4_ | (uint)!bVar11 * (int)pfVar13[7]);
      uVar15 = uVar15 + 8;
    } while (uVar14 != uVar15);
    if ((1 < (int)uVar2) && (((this->super_EigenDecomposition<float,_1>).kFlags & 0x200000U) != 0))
    {
      pfVar13 = pfVar12 + uVar17;
      uVar15 = 0;
      uVar14 = uVar17;
      do {
        uVar16 = 1;
        pfVar18 = pfVar13;
        do {
          fVar3 = pfVar12[uVar16];
          pfVar12[uVar16] = *pfVar18;
          *pfVar18 = fVar3;
          uVar16 = uVar16 + 1;
          pfVar18 = pfVar18 + uVar17;
        } while (uVar14 != uVar16);
        uVar15 = uVar15 + 1;
        uVar14 = uVar14 - 1;
        pfVar13 = pfVar13 + uVar17 + 1;
        pfVar12 = pfVar12 + uVar17 + 1;
      } while (uVar15 != uVar2 - 1);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										             const double* inEigenVectors,
                                                     const double* inInverseEigenVectors,
                                                     const double* inEigenValues) {
    
	beagleMemCpy(gEigenValues[eigenIndex],inEigenValues,kEigenValuesSize);
	const int len = kStateCount * kStateCount;
	beagleMemCpy(gEMatrices[eigenIndex],inEigenVectors,len);
	beagleMemCpy(gIMatrices[eigenIndex],inInverseEigenVectors,len);
    if (kFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED) // TODO: optimize, might not need to transpose here
        transposeSquareMatrix(gIMatrices[eigenIndex], kStateCount);
}